

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm.c
# Opt level: O2

void av1_round_shift_array_c(int32_t *arr,int size,int bit)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (bit != 0) {
    bVar1 = (byte)bit;
    if (bit < 1) {
      uVar2 = 0;
      uVar3 = (ulong)(uint)size;
      if (size < 1) {
        uVar3 = uVar2;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        lVar4 = (long)arr[uVar2] << (-bVar1 & 0x3f);
        if (0x7ffffffe < lVar4) {
          lVar4 = 0x7fffffff;
        }
        if (lVar4 < -0x7fffffff) {
          lVar4 = -0x80000000;
        }
        arr[uVar2] = (int32_t)lVar4;
      }
    }
    else {
      uVar2 = 0;
      uVar3 = (ulong)(uint)size;
      if (size < 1) {
        uVar3 = uVar2;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        arr[uVar2] = (int32_t)((long)arr[uVar2] + (1L << (bVar1 - 1 & 0x3f)) >> (bVar1 & 0x3f));
      }
    }
  }
  return;
}

Assistant:

void av1_round_shift_array_c(int32_t *arr, int size, int bit) {
  int i;
  if (bit == 0) {
    return;
  } else {
    if (bit > 0) {
      for (i = 0; i < size; i++) {
        arr[i] = round_shift(arr[i], bit);
      }
    } else {
      for (i = 0; i < size; i++) {
        arr[i] = (int32_t)clamp64(((int64_t)1 << (-bit)) * arr[i], INT32_MIN,
                                  INT32_MAX);
      }
    }
  }
}